

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O2

void __thiscall
duckdb::DictionaryDecoder::DictionaryDecoder(DictionaryDecoder *this,ColumnReader *reader)

{
  this->reader = reader;
  this->offset_buffer = reader->encoding_buffers;
  (this->dict_decoder).
  super_unique_ptr<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super___uniq_ptr_impl<duckdb::RleBpDecoder,_std::default_delete<duckdb::RleBpDecoder>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::RleBpDecoder_*,_std::default_delete<duckdb::RleBpDecoder>_>.
  super__Head_base<0UL,_duckdb::RleBpDecoder_*,_false>._M_head_impl = (RleBpDecoder *)0x0;
  SelectionVector::SelectionVector(&this->valid_sel,0x800);
  SelectionVector::SelectionVector(&this->dictionary_selection_vector,0x800);
  this->dictionary_size = 0;
  (this->dictionary).super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
  super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl = (Vector *)0x0;
  (this->filter_result).super_unique_ptr<bool[],_std::default_delete<bool[]>_>._M_t.
  super___uniq_ptr_impl<bool,_std::default_delete<bool[]>_>._M_t.
  super__Tuple_impl<0UL,_bool_*,_std::default_delete<bool[]>_>.super__Head_base<0UL,_bool_*,_false>.
  _M_head_impl = (bool *)0x0;
  (this->dictionary_id)._M_dataplus._M_p = (pointer)&(this->dictionary_id).field_2;
  (this->dictionary_id)._M_string_length = 0;
  (this->dictionary_id).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

DictionaryDecoder::DictionaryDecoder(ColumnReader &reader)
    : reader(reader), offset_buffer(reader.encoding_buffers[0]), valid_sel(STANDARD_VECTOR_SIZE),
      dictionary_selection_vector(STANDARD_VECTOR_SIZE), dictionary_size(0) {
}